

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void pmswinc_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint uVar3;
  byte counter;
  uint local_24;
  uint32_t new_pmswinc;
  uint i;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  for (local_24 = 0; uVar2 = pmu_num_counters(env), local_24 < uVar2; local_24 = local_24 + 1) {
    counter = (byte)local_24;
    if ((((value & 1L << (counter & 0x3f)) != 0) &&
        (_Var1 = pmu_counter_enabled(env,counter), _Var1)) &&
       (((env->cp15).c14_pmevtyper[local_24] & 0xffff) == 0)) {
      pmevcntr_op_start(env,counter);
      uVar3 = (int)(env->cp15).c14_pmevcntr[local_24] + 1;
      if (((env->cp15).c14_pmevcntr[local_24] & (ulong)(uVar3 ^ 0xffffffff) & 0xffffffff80000000) !=
          0) {
        (env->cp15).c9_pmovsr = 1L << (counter & 0x3f) | (env->cp15).c9_pmovsr;
      }
      (env->cp15).c14_pmevcntr[local_24] = (ulong)uVar3;
      pmevcntr_op_finish(env,counter);
    }
  }
  return;
}

Assistant:

static void pmswinc_write(CPUARMState *env, const ARMCPRegInfo *ri,
                          uint64_t value)
{
    unsigned int i;
    for (i = 0; i < pmu_num_counters(env); i++) {
        /* Increment a counter's count iff: */
        if ((value & (1ULL << i)) && /* counter's bit is set */
                /* counter is enabled and not filtered */
                pmu_counter_enabled(env, i) &&
                /* counter is SW_INCR */
                (env->cp15.c14_pmevtyper[i] & PMXEVTYPER_EVTCOUNT) == 0x0) {
            pmevcntr_op_start(env, i);

            /*
             * Detect if this write causes an overflow since we can't predict
             * PMSWINC overflows like we can for other events
             */
            uint32_t new_pmswinc = env->cp15.c14_pmevcntr[i] + 1;

            if (env->cp15.c14_pmevcntr[i] & ~new_pmswinc & INT32_MIN) {
                env->cp15.c9_pmovsr |= (1ULL << i);
            }

            env->cp15.c14_pmevcntr[i] = new_pmswinc;

            pmevcntr_op_finish(env, i);
        }
    }
}